

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O1

int __thiscall QFbScreen::raise(QFbScreen *this,int __sig)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  QWindow *pQVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long in_FS_OFFSET;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__sig);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x30) != 0) {
    plVar7 = plVar6;
    plVar8 = (long *)0xfffffffffffffff8;
    do {
      uVar5 = (uint)plVar7;
      plVar1 = plVar8 + -*(long *)(this + 0x30);
      if (plVar1 == (long *)0xfffffffffffffff8) goto LAB_001138b0;
      plVar7 = plVar8 + 1;
      plVar2 = (long *)(*(long *)(this + 0x28) + 8 + (long)plVar8);
      plVar8 = plVar7;
    } while ((long *)*plVar2 != plVar6);
    uVar5 = (uint)((long)plVar7 >> 3);
LAB_001138b0:
    if (plVar1 != (long *)0xfffffffffffffff8) goto LAB_001138bd;
  }
  uVar5 = 0xffffffff;
LAB_001138bd:
  if (0 < (int)uVar5) {
    QList<QFbWindow_*>::move((QList<QFbWindow_*> *)(this + 0x20),(ulong)(uVar5 & 0x7fffffff),0);
    (**(code **)(*plVar6 + 0x30))(plVar6);
    (**(code **)(*(long *)this + 0xd0))(this);
    pQVar4 = topWindow(this);
    QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
              (pQVar4,7);
    (**(code **)(*(long *)this + 0xb8))(this,pQVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::raise(QFbWindow *window)
{
    int index = mWindowStack.indexOf(window);
    if (index <= 0)
        return;
    mWindowStack.move(index, 0);
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}